

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__profile_gles2_type____newparam
          (ColladaParserAutoGen15Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__profile_gles2_type____newparam()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__profile_gles2_type____newparam();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}